

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSignal.h
# Opt level: O3

CollectorResult __thiscall
Simple::Lib::ProtoSignal<bool_(),_Simple::CollectorWhile0<bool>_>::emit
          (ProtoSignal<bool_(),_Simple::CollectorWhile0<bool>_> *this)

{
  int iVar1;
  SignalLink *pSVar2;
  bool bVar3;
  SignalLink *this_00;
  CollectorResult CVar4;
  
  this_00 = this->callback_ring_;
  if (this_00 == (SignalLink *)0x0) {
    CVar4 = false;
  }
  else {
    iVar1 = this_00->ref_count;
    this_00->ref_count = iVar1 + 1;
    if (iVar1 < 0) {
LAB_00109a66:
      __assert_fail("ref_count > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/billyquith[P]SimpleSignal/SimpleSignal.h"
                    ,0x51,
                    "void Simple::Lib::ProtoSignal<bool (), Simple::CollectorWhile0<bool>>::SignalLink::incref()"
                   );
    }
    do {
      if (((this_00->function).super__Function_base._M_manager != (_Manager_type)0x0) &&
         (bVar3 = (*(this_00->function)._M_invoker)((_Any_data *)&this_00->function), bVar3)) {
        CVar4 = true;
        goto LAB_00109a51;
      }
      pSVar2 = this_00->next;
      iVar1 = pSVar2->ref_count;
      pSVar2->ref_count = iVar1 + 1;
      if (iVar1 < 0) goto LAB_00109a66;
      SignalLink::decref(this_00);
      this_00 = pSVar2;
    } while (pSVar2 != this->callback_ring_);
    CVar4 = false;
LAB_00109a51:
    SignalLink::decref(this_00);
  }
  return CVar4;
}

Assistant:

CollectorResult
  emit (Args... args)
  {
    Collector collector;
    if (!callback_ring_)
      return collector.result();
    SignalLink *link = callback_ring_;
    link->incref();
    do
      {
        if (link->function != nullptr)
          {
            const bool continue_emission = this->invoke (collector, link->function, args...);
            if (!continue_emission)
              break;
          }
        SignalLink *old = link;
        link = old->next;
        link->incref();
        old->decref();
      }
    while (link != callback_ring_);
    link->decref();
    return collector.result();
  }